

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3io.c
# Opt level: O0

int rd_attr_val(FILE *fp,char *attr,char *val)

{
  int iVar1;
  char *val_local;
  char *attr_local;
  FILE *fp_local;
  
  __isoc99_fscanf(fp,"%s",attr);
  iVar1 = strcmp(attr,"endhdr");
  if (iVar1 != 0) {
    __isoc99_fscanf(fp," %[^\n]",val);
  }
  else {
    fgetc((FILE *)fp);
    *val = '\0';
  }
  fp_local._4_4_ = (uint)(iVar1 != 0);
  return fp_local._4_4_;
}

Assistant:

static int
rd_attr_val(FILE *fp,
	    char *attr,
	    char *val)
{
    fscanf(fp, "%s", attr);
    if (strcmp(attr, "endhdr") == 0) {
	fgetc(fp);	/* throw away newline */
	val[0] = '\0';
	return 0;
    }
    fscanf(fp, " %[^\n]", val);
    return 1;
}